

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O3

ssize_t __thiscall notch::io::IDXReader::read(IDXReader *this,int __fd,void *__buf,size_t __nbytes)

{
  runtime_error *this_00;
  undefined4 in_register_00000034;
  IDXReader *this_01;
  size_t sVar1;
  long lVar2;
  Dataset labels;
  Dataset images;
  Dataset local_60;
  Dataset local_48;
  
  this_01 = (IDXReader *)CONCAT44(in_register_00000034,__fd);
  this->imagesShape[2] = 0;
  this->imagesShape[3] = 0;
  this->imagesShape[0] = 0;
  this->imagesShape[1] = 0;
  this->imagesDims = 0;
  this->labelsDims = 0;
  this->imagesInPtr = (istream *)0x0;
  this->labelsInPtr = (istream *)0x0;
  this->labelsShape[0] = 0;
  readDataset(&local_48,this_01,(istream *)__buf,&this_01->imagesDims,this_01->imagesShape);
  readDataset(&local_60,this_01,(istream *)__nbytes,&this_01->labelsDims,this_01->labelsShape);
  if (this_01->labelsDims == 1) {
    sVar1 = this_01->imagesShape[0];
    if (sVar1 == this_01->labelsShape[0]) {
      if (sVar1 != 0) {
        lVar2 = 0;
        do {
          core::LabeledDataset::append
                    ((LabeledDataset *)this,
                     (Input *)((long)&(local_48.
                                       super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_size + lVar2),
                     (Output *)
                     ((long)&(local_60.
                              super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_size + lVar2));
          lVar2 = lVar2 + 0x10;
          sVar1 = sVar1 - 1;
        } while (sVar1 != 0);
      }
      core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
                (&local_60);
      core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
                (&local_48);
      return (ssize_t)this;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"IDXReader: # of images and labels don\'t match");
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"IDXReader: labels dataset is not 1D");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

LabeledDataset read(std::istream &imagesIn, std::istream &labelsIn) {
        LabeledDataset dataset;
        Dataset images = readDataset(imagesIn, &imagesDims, imagesShape);
        Dataset labels = readDataset(labelsIn, &labelsDims, labelsShape);
        if (labelsDims != 1) {
            throw std::runtime_error("IDXReader: labels dataset is not 1D");
        }
        if (imagesShape[0] != labelsShape[0]) {
            throw std::runtime_error("IDXReader: # of images and labels don't match");
        }
        size_t nSamples = imagesShape[0];
        for (size_t i = 0; i < nSamples; ++i) {
            dataset.append(images[i], labels[i]);
        }
        return dataset;
    }